

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O2

string_t duckdb::StringSliceOperations::SliceValueWithSteps
                   (Vector *result,SelectionVector *sel,string_t input,int64_t begin,int64_t end,
                   int64_t step,idx_t *sel_idx)

{
  InternalException *this;
  allocator local_39;
  string local_38;
  
  this = (InternalException *)__cxa_allocate_exception(0x10,sel,input.value._0_8_,input.value._8_8_)
  ;
  ::std::__cxx11::string::string
            ((string *)&local_38,"Slicing with steps is not supported for strings",&local_39);
  InternalException::InternalException(this,&local_38);
  __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string_t SliceValueWithSteps(Vector &result, SelectionVector &sel, string_t input, int64_t begin,
	                                    int64_t end, int64_t step, idx_t &sel_idx) {
		throw InternalException("Slicing with steps is not supported for strings");
	}